

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBoolean(OptimizeInstructions *this,Expression *boolean)

{
  uint uVar1;
  Id IVar2;
  int iVar3;
  ulong uVar4;
  uintptr_t uVar5;
  char *pcVar6;
  undefined4 uVar7;
  bool bVar8;
  BinaryOp BVar9;
  Index bits;
  Expression *pEVar10;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  ulong uVar11;
  ulong uVar12;
  Literal *this_01;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_120;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_f8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_e8;
  undefined8 local_d8;
  long local_c8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a8;
  long local_98;
  Expression **local_88;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_58;
  Expression *local_40;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  IVar2 = boolean->_id;
  if (boolean != (Expression *)0x0 && IVar2 == UnaryId) {
    if (*(int *)(boolean + 1) != 0x14) {
      return boolean;
    }
    pEVar10 = (Expression *)boolean[1].type.id;
    if (pEVar10->_id == BinaryId) {
      BVar9 = invertBinaryOp(this,*(BinaryOp *)(pEVar10 + 1));
      if (BVar9 == InvalidBinary) {
        return boolean;
      }
      *(BinaryOp *)(pEVar10 + 1) = BVar9;
      return pEVar10;
    }
    if (pEVar10->_id != UnaryId) {
      return boolean;
    }
    if (*(int *)(pEVar10 + 1) != 0x14) {
      return boolean;
    }
    return (Expression *)pEVar10[1].type.id;
  }
  if (IVar2 != BinaryId || boolean == (Expression *)0x0) {
    if (IVar2 == BlockId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      uVar5 = boolean[2].type.id;
      if (uVar5 == 0) {
        return boolean;
      }
      pEVar10 = optimizeBoolean(this,*(Expression **)(*(long *)(boolean + 2) + -8 + uVar5 * 8));
      uVar5 = boolean[2].type.id;
      if (uVar5 != 0) {
        *(Expression **)(*(long *)(boolean + 2) + -8 + uVar5 * 8) = pEVar10;
        return boolean;
      }
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    if (IVar2 == IfId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar10 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
      boolean[1].type.id = (uintptr_t)pEVar10;
      pEVar10 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar10;
      return boolean;
    }
    if (IVar2 != SelectId || boolean == (Expression *)0x0) {
      if (IVar2 != TryId || boolean == (Expression *)0x0) {
        return boolean;
      }
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar10 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar10;
      if (*(long *)(boolean + 5) == 0) {
        return boolean;
      }
      uVar11 = 0;
      uVar12 = 1;
      do {
        pEVar10 = optimizeBoolean(this,*(Expression **)(boolean[4].type.id + uVar11 * 8));
        uVar4 = *(ulong *)(boolean + 5);
        if (uVar4 <= uVar11) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        *(Expression **)(boolean[4].type.id + uVar11 * 8) = pEVar10;
        bVar8 = uVar12 < uVar4;
        uVar11 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar8);
      return boolean;
    }
    pEVar10 = optimizeBoolean(this,*(Expression **)(boolean + 1));
    *(Expression **)(boolean + 1) = pEVar10;
    pEVar10 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar10;
    return boolean;
  }
  iVar3 = *(int *)(boolean + 1);
  if (iVar3 < 8) {
    if (iVar3 == 1) {
      pcVar6 = (char *)boolean[1].type.id;
      if (*pcVar6 == '\x0e') {
        if (*(long *)(pcVar6 + 0x20) != 2) {
LAB_009cde87:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x120,"int32_t wasm::Literal::geti32() const");
        }
        if (*(int *)(pcVar6 + 0x10) == 0) {
          return *(Expression **)(boolean + 2);
        }
      }
    }
    else if ((iVar3 == 5) && (**(char **)(boolean + 2) == '\x0e')) {
      this_01 = (Literal *)(*(char **)(boolean + 2) + 0x10);
      bVar8 = Literal::isSignedMin(this_01);
      if (bVar8) {
LAB_009cdb76:
        *(undefined4 *)(boolean + 1) = 7;
        bVar8 = Literal::isSignedMin(this_01);
        if (bVar8) {
          Literal::makeSignedMax((Literal *)&local_a8.func,(Type)0x2);
          Literal::operator=(this_01,(Literal *)&local_a8.func);
          this_00 = &local_a8;
        }
        else {
          Literal::abs((Literal *)&local_e8.func,(int)this_01);
          Literal::makeOne((Literal *)&local_68.func,(Type)0x2);
          Literal::sub((Literal *)&local_a8.func,(Literal *)&local_e8.func,(Literal *)&local_68.func
                      );
          Literal::operator=(this_01,(Literal *)&local_a8.func);
          Literal::~Literal((Literal *)&local_a8.func);
          Literal::~Literal((Literal *)&local_68.func);
          this_00 = &local_e8;
        }
        Literal::~Literal((Literal *)&this_00->func);
        return boolean;
      }
      Literal::abs((Literal *)&local_a8.func,(int)this_01);
      if (local_98 != 2) goto LAB_009cde87;
      uVar7 = local_a8.i32;
      if (local_a8.i32 == 0) {
        Literal::~Literal((Literal *)&local_a8.func);
      }
      else {
        uVar1 = local_a8.i32 - 1;
        Literal::~Literal((Literal *)&local_a8.func);
        if ((uVar7 & uVar1) == 0) goto LAB_009cdb76;
      }
    }
  }
  else if (iVar3 == 8) {
    pEVar10 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar10;
    pEVar10 = optimizeBoolean(this,*(Expression **)(boolean + 2));
    *(Expression **)(boolean + 2) = pEVar10;
  }
  else if ((iVar3 == 0x10) && (pcVar6 = *(char **)(boolean + 2), *pcVar6 == '\x0e')) {
    if (*(long *)(pcVar6 + 0x20) != 2) goto LAB_009cde87;
    if (*(int *)(pcVar6 + 0x10) == 0) {
      return (Expression *)boolean[1].type.id;
    }
  }
  if ((boolean->type).id == 2) {
    if (boolean->_id == UnaryId) {
      if (1 < *(int *)(boolean + 1) - 0x2fU) {
        return boolean;
      }
      pEVar10 = (Expression *)boolean[1].type.id;
    }
    else {
      local_88 = &extended;
      extended._0_4_ = 0;
      local_c8 = (long)&extended + 4;
      extended._4_4_ = 0;
      local_f8.binder = &local_40;
      local_40 = (Expression *)0x0;
      local_120.submatchers.curr = &local_f8;
      local_120.submatchers.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
            *)&local_a8;
      local_98 = 0;
      local_a8.i64 = 0;
      local_58.curr = &local_120;
      local_120.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_120.data = ShlInt32;
      local_58.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
            *)&local_e8;
      local_d8 = 0;
      local_e8.i64 = 0;
      local_68.i64 = 0;
      local_68._8_4_ = 0xb;
      if ((((boolean->_id != BinaryId) || (*(int *)(boolean + 1) != 0xb)) ||
          (bVar8 = Match::Internal::
                   Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                   ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                            )boolean,&local_58), !bVar8)) ||
         (((int)extended != extended._4_4_ || (pEVar10 = local_40, (int)extended == 0)))) {
        pEVar10 = (Expression *)0x0;
      }
    }
    if (pEVar10 != (Expression *)0x0) {
      bits = Properties::getSignExtBits(boolean);
      boolean = makeZeroExt(this,pEVar10,bits);
    }
  }
  return boolean;
}

Assistant:

Expression* optimizeBoolean(Expression* boolean) {
    // TODO use a general getFallthroughs
    if (auto* unary = boolean->dynCast<Unary>()) {
      if (unary) {
        if (unary->op == EqZInt32) {
          auto* unary2 = unary->value->dynCast<Unary>();
          if (unary2 && unary2->op == EqZInt32) {
            // double eqz
            return unary2->value;
          }
          if (auto* binary = unary->value->dynCast<Binary>()) {
            // !(x <=> y)   ==>   x <!=> y
            auto op = invertBinaryOp(binary->op);
            if (op != InvalidBinary) {
              binary->op = op;
              return binary;
            }
          }
        }
      }
    } else if (auto* binary = boolean->dynCast<Binary>()) {
      if (binary->op == SubInt32) {
        if (auto* c = binary->left->dynCast<Const>()) {
          if (c->value.geti32() == 0) {
            // bool(0 - x)   ==>   bool(x)
            return binary->right;
          }
        }
      } else if (binary->op == OrInt32) {
        // an or flowing into a boolean context can consider each input as
        // boolean
        binary->left = optimizeBoolean(binary->left);
        binary->right = optimizeBoolean(binary->right);
      } else if (binary->op == NeInt32) {
        if (auto* c = binary->right->dynCast<Const>()) {
          // x != 0 is just x if it's used as a bool
          if (c->value.geti32() == 0) {
            return binary->left;
          }
          // TODO: Perhaps use it for separate final pass???
          // x != -1   ==>    x ^ -1
          // if (num->value.geti32() == -1) {
          //   binary->op = XorInt32;
          //   return binary;
          // }
        }
      } else if (binary->op == RemSInt32) {
        // bool(i32(x) % C_pot)  ==>  bool(x & (C_pot - 1))
        // bool(i32(x) % min_s)  ==>  bool(x & max_s)
        if (auto* c = binary->right->dynCast<Const>()) {
          if (c->value.isSignedMin() ||
              Bits::isPowerOf2(c->value.abs().geti32())) {
            binary->op = AndInt32;
            if (c->value.isSignedMin()) {
              c->value = Literal::makeSignedMax(Type::i32);
            } else {
              c->value = c->value.abs().sub(Literal::makeOne(Type::i32));
            }
            return binary;
          }
        }
      }
      if (auto* ext = Properties::getSignExtValue(binary)) {
        // use a cheaper zero-extent, we just care about the boolean value
        // anyhow
        return makeZeroExt(ext, Properties::getSignExtBits(binary));
      }
    } else if (auto* block = boolean->dynCast<Block>()) {
      if (block->type == Type::i32 && block->list.size() > 0) {
        block->list.back() = optimizeBoolean(block->list.back());
      }
    } else if (auto* iff = boolean->dynCast<If>()) {
      if (iff->type == Type::i32) {
        iff->ifTrue = optimizeBoolean(iff->ifTrue);
        iff->ifFalse = optimizeBoolean(iff->ifFalse);
      }
    } else if (auto* select = boolean->dynCast<Select>()) {
      select->ifTrue = optimizeBoolean(select->ifTrue);
      select->ifFalse = optimizeBoolean(select->ifFalse);
    } else if (auto* tryy = boolean->dynCast<Try>()) {
      if (tryy->type == Type::i32) {
        tryy->body = optimizeBoolean(tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = optimizeBoolean(tryy->catchBodies[i]);
        }
      }
    }
    // TODO: recurse into br values?
    return boolean;
  }